

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::UnionInPlace
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  uint uVar3;
  CharSet<char16_t> *pCVar4;
  bool bVar5;
  Char kc;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  CharSetInner *this_00;
  undefined4 extraout_var;
  TrackAllocData local_50;
  uint local_24;
  CharSet<char16_t> *pCStack_20;
  uint i;
  CharSet<char16_t> *other_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  pCStack_20 = other;
  other_local = (CharSet<char16_t> *)allocator;
  allocator_local = (ArenaAllocator *)this;
  bVar5 = IsCompact(other);
  if (bVar5) {
    for (local_24 = 0; uVar3 = local_24, uVar6 = GetCompactLength(pCStack_20), pCVar4 = other_local,
        uVar3 < uVar6; local_24 = local_24 + 1) {
      kc = GetCompactChar(pCStack_20,local_24);
      Set(this,(ArenaAllocator *)pCVar4,kc);
    }
  }
  else {
    bVar5 = IsCompact(this);
    if (bVar5) {
      SwitchRepresentations(this,(ArenaAllocator *)other_local);
    }
    bVar5 = IsCompact(this);
    if ((bVar5) || (bVar5 = IsCompact(pCStack_20), bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x48e,"(!IsCompact() && !other.IsCompact())",
                         "!IsCompact() && !other.IsCompact()");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    CharBitvec::UnionInPlace(&(this->rep).full.direct,&(pCStack_20->rep).full.direct);
    pCVar4 = other_local;
    if ((pCStack_20->rep).compact.countPlusOne != 0) {
      if ((undefined8 *)(pCStack_20->rep).compact.countPlusOne == &CharSetFull::Instance) {
        if ((this->rep).compact.countPlusOne != 0) {
          pCVar1 = (this->rep).full.root;
          (**pCVar1->_vptr_CharSetNode)(pCVar1,other_local);
        }
        (this->rep).full.root = (CharSetNode *)&CharSetFull::Instance;
      }
      else {
        if ((this->rep).compact.countPlusOne == 0) {
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_50,(type_info *)&CharSetInner::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                     ,0x49d);
          alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pCVar4,&local_50);
          this_00 = (CharSetInner *)
                    new<Memory::ArenaAllocator>(0x88,(ArenaAllocator *)alloc,0x3f67b0);
          CharSetInner::CharSetInner(this_00);
          (this->rep).full.root = (CharSetNode *)this_00;
        }
        pCVar1 = (this->rep).full.root;
        iVar7 = (*pCVar1->_vptr_CharSetNode[4])
                          (pCVar1,other_local,2,(pCStack_20->rep).compact.countPlusOne);
        (this->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar7);
      }
    }
  }
  return;
}

Assistant:

void CharSet<char16>::UnionInPlace(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                Set(allocator, other.GetCompactChar(i));
            }
            return;
        }

        if (IsCompact())
            SwitchRepresentations(allocator);

        Assert(!IsCompact() && !other.IsCompact());

        rep.full.direct.UnionInPlace(other.rep.full.direct);

        if (other.rep.full.root != nullptr)
        {
            if (other.rep.full.root == CharSetFull::TheFullNode)
            {
                if (rep.full.root != nullptr)
                    rep.full.root->FreeSelf(allocator);
                rep.full.root = CharSetFull::TheFullNode;
            }
            else
            {
                if (rep.full.root == nullptr)
                    rep.full.root = Anew(allocator, CharSetInner);
                rep.full.root = rep.full.root->UnionInPlace(allocator, CharSetNode::levels - 1, other.rep.full.root);
            }
        }
    }